

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.hxx
# Opt level: O0

void __thiscall nuraft::stat_elem::reset(stat_elem *this)

{
  Type TVar1;
  stat_elem *in_RDI;
  Histogram empty_histogram;
  undefined4 in_stack_ffffffffffffffbc;
  Histogram *in_stack_ffffffffffffffc0;
  Histogram *in_stack_ffffffffffffffe0;
  Histogram *in_stack_ffffffffffffffe8;
  
  TVar1 = in_RDI->stat_type_;
  if (TVar1 != COUNTER) {
    if (TVar1 == HISTOGRAM) {
      Histogram::Histogram(in_stack_ffffffffffffffc0,(double)CONCAT44(in_stack_ffffffffffffffbc,1));
      Histogram::operator=(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
      Histogram::~Histogram((Histogram *)in_RDI);
      return;
    }
    if (TVar1 != GAUGE) {
      return;
    }
  }
  set(in_RDI,0);
  return;
}

Assistant:

void reset() {
        switch (stat_type_) {
        case COUNTER:
        case GAUGE:
            set(0);
            break;
        case HISTOGRAM: {
            Histogram empty_histogram;
            *hist_ = empty_histogram;
            break; }
        default: break;
        }
    }